

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O1

void __thiscall CTcLibParser::CTcLibParser(CTcLibParser *this,char *lib_name)

{
  char *pcVar1;
  char lib_path [4096];
  char acStack_1018 [4096];
  
  this->_vptr_CTcLibParser = (_func_int **)&PTR__CTcLibParser_00358750;
  os_get_path_name(acStack_1018,0x1000,lib_name);
  pcVar1 = lib_copy_str(acStack_1018);
  this->lib_path_ = pcVar1;
  pcVar1 = lib_copy_str(lib_name);
  this->lib_name_ = pcVar1;
  this->err_cnt_ = 0;
  this->linenum_ = 0;
  return;
}

Assistant:

CTcLibParser::CTcLibParser(const char *lib_name)
{
    char lib_path[OSFNMAX];

    /* 
     *   Extract the library's directory path.  Since files within a library
     *   are always relative to the directory containing the library itself,
     *   we use the full path to the library as the starting point for each
     *   file found within the library.  
     */
    os_get_path_name(lib_path, sizeof(lib_path), lib_name);

    /* remember the library path */
    lib_path_ = lib_copy_str(lib_path);

    /* remember the name of the library */
    lib_name_ = lib_copy_str(lib_name);

    /* no errors yet */
    err_cnt_ = 0;

    /* no lines read yet */
    linenum_ = 0;
}